

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

int st__strhash(char *string,int modulus)

{
  uint uVar1;
  byte bVar2;
  byte *pbVar3;
  
  if (modulus < 1) {
    __assert_fail("modulus > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/st/st.c"
                  ,0x1c5,"int st__strhash(const char *, int)");
  }
  bVar2 = *string;
  if (bVar2 == 0) {
    uVar1 = 0;
  }
  else {
    pbVar3 = (byte *)(string + 1);
    uVar1 = 0;
    do {
      uVar1 = uVar1 * 0x3e5 + (uint)bVar2;
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
  }
  return uVar1 % (uint)modulus;
}

Assistant:

int
 st__strhash(const char *string, int modulus)
{
    unsigned char * ustring = (unsigned char *)string;
    unsigned c, val = 0;
    assert( modulus > 0 );    
    while ((c = *ustring++) != '\0') {
        val = val*997 + c;
    }
    return (int)(val%modulus);
}